

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  uint8_t type1;
  uint8_t type2;
  ushort key;
  uint uVar1;
  container_t *c1;
  container_t *c2;
  roaring_bitmap_t *ra;
  uint uVar2;
  roaring_bitmap_t *prVar3;
  roaring_pq_t *pq;
  size_t sVar4;
  roaring_array_t *ra_00;
  ushort *puVar5;
  uint end_index;
  roaring_pq_element_t *prVar6;
  long lVar7;
  uint32_t i;
  roaring_array_t *prVar8;
  uint uVar9;
  uint16_t key_00;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  uint local_bc;
  container_t *local_98;
  roaring_pq_element_t newelement;
  roaring_pq_element_t X;
  roaring_pq_element_t x2;
  
  if (number == 1) {
    prVar3 = roaring_bitmap_copy(*x);
    return prVar3;
  }
  if (number == 0) {
    prVar3 = roaring_bitmap_create();
    return prVar3;
  }
  lVar7 = (ulong)number * 0x18;
  pq = (roaring_pq_t *)roaring_malloc(lVar7 + 0x10);
  prVar6 = (roaring_pq_element_t *)(pq + 1);
  pq->elements = prVar6;
  pq->size = (ulong)number;
  for (lVar10 = 0; lVar7 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
    prVar3 = *x;
    *(roaring_bitmap_t **)((long)&prVar6->bitmap + lVar10) = prVar3;
    (&prVar6->is_temporary)[lVar10] = false;
    sVar4 = roaring_bitmap_portable_size_in_bytes(prVar3);
    prVar6 = pq->elements;
    *(size_t *)((long)&prVar6->size + lVar10) = sVar4;
    x = x + 1;
  }
  for (i = number >> 1; -1 < (int)i; i = i - 1) {
    percolate_down(pq,i);
  }
LAB_00122294:
  while( true ) {
    if (pq->size < 2) {
      pq_poll(&X,pq);
      roaring_bitmap_repair_after_lazy(X.bitmap);
      roaring_free(pq);
      return X.bitmap;
    }
    pq_poll(&X,pq);
    pq_poll(&x2,pq);
    ra = x2.bitmap;
    prVar3 = X.bitmap;
    if (X.is_temporary != true) break;
    if (x2.is_temporary != false) {
      newelement.size = newelement.size & 0xffffffffffffff00;
      uVar1 = ((X.bitmap)->high_low_container).size;
      if (uVar1 == 0) {
        roaring_bitmap_free(X.bitmap);
        ra_00 = &ra->high_low_container;
      }
      else {
        end_index = ((x2.bitmap)->high_low_container).size;
        if (end_index != 0) {
          uVar9 = end_index;
          if ((int)uVar1 < (int)end_index) {
            uVar9 = uVar1;
          }
          ra_00 = &roaring_bitmap_create_with_capacity(uVar9)->high_low_container;
          puVar5 = (prVar3->high_low_container).keys;
          key_00 = *(ra->high_low_container).keys;
          uVar11 = 0;
          local_bc = 0;
LAB_00122333:
          do {
            key = *puVar5;
            while( true ) {
              uVar9 = (uint)uVar11;
              prVar8 = &ra->high_low_container;
              if (key == key_00) break;
              if (key < key_00) {
                ra_append(ra_00,key,(prVar3->high_low_container).containers[local_bc & 0xffff],
                          (prVar3->high_low_container).typecodes[local_bc & 0xffff]);
                local_bc = local_bc + 1;
                if (local_bc == uVar1) goto LAB_0012262f;
                puVar5 = (ushort *)
                         ((ulong)((local_bc & 0xffff) * 2) + (long)(prVar3->high_low_container).keys
                         );
                goto LAB_00122333;
              }
              ra_append(ra_00,key_00,(ra->high_low_container).containers[uVar11 & 0xffff],
                        (ra->high_low_container).typecodes[uVar11 & 0xffff]);
              uVar2 = end_index;
              if (end_index - 1 == uVar9) goto LAB_001225ff;
              uVar11 = (ulong)(uVar9 + 1);
              key_00 = (ra->high_low_container).keys[uVar11 & 0xffff];
            }
            ra_unshare_container_at_index(&prVar3->high_low_container,(uint16_t)local_bc);
            type1 = (prVar3->high_low_container).typecodes[local_bc & 0xffff];
            c1 = (prVar3->high_low_container).containers[local_bc & 0xffff];
            ra_unshare_container_at_index(&ra->high_low_container,(uint16_t)uVar11);
            type2 = (ra->high_low_container).typecodes[uVar9 & 0xffff];
            c2 = (ra->high_low_container).containers[uVar9 & 0xffff];
            if ((type2 == '\x01') && (type1 != '\x01')) {
              local_98 = container_lazy_ior(c2,'\x01',c1,type1,(uint8_t *)&newelement);
              container_free(c1,type1);
              if (local_98 != c2) {
                container_free(c2,'\x01');
              }
            }
            else {
              local_98 = container_lazy_ior(c1,type1,c2,type2,(uint8_t *)&newelement);
              container_free(c2,type2);
              if (local_98 != c1) {
                container_free(c1,type1);
              }
            }
            ra_append(ra_00,key,local_98,(uint8_t)newelement.size);
            local_bc = local_bc + 1;
            if ((local_bc == uVar1) || (end_index - 1 == uVar9)) goto LAB_00122690;
            uVar11 = (ulong)(uVar9 + 1);
            puVar5 = (ushort *)
                     ((ulong)((local_bc & 0xffff) * 2) + (long)(prVar3->high_low_container).keys);
            key_00 = (ra->high_low_container).keys[uVar9 + 1 & 0xffff];
          } while( true );
        }
        roaring_bitmap_free(x2.bitmap);
        ra_00 = &prVar3->high_low_container;
      }
      goto LAB_0012265e;
    }
    roaring_bitmap_lazy_or_inplace(X.bitmap,x2.bitmap,false);
    X.size = roaring_bitmap_portable_size_in_bytes(prVar3);
    pq_add(pq,&X);
  }
  if (x2.is_temporary != false) goto code_r0x00122547;
  prVar3 = roaring_bitmap_lazy_or(X.bitmap,x2.bitmap,false);
  newelement.size = roaring_bitmap_portable_size_in_bytes(prVar3);
  newelement.is_temporary = true;
  newelement.bitmap = prVar3;
  goto LAB_0012267e;
code_r0x00122547:
  roaring_bitmap_lazy_or_inplace(x2.bitmap,X.bitmap,false);
  x2.size = roaring_bitmap_portable_size_in_bytes(ra);
  pq_add(pq,&x2);
  goto LAB_00122294;
LAB_00122690:
  uVar2 = uVar9 + 1;
LAB_001225ff:
  uVar9 = uVar2;
  if ((local_bc == uVar1) ||
     (bVar12 = uVar9 == end_index, prVar8 = &prVar3->high_low_container, end_index = uVar1,
     uVar9 = local_bc, bVar12)) {
LAB_0012262f:
    ra_append_move_range(ra_00,prVar8,uVar9,end_index);
  }
  ra_clear_without_containers(&prVar3->high_low_container);
  ra_clear_without_containers(&ra->high_low_container);
  roaring_free(prVar3);
  roaring_free(ra);
LAB_0012265e:
  newelement.size = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)ra_00);
  newelement.is_temporary = &ra->high_low_container != ra_00 || &prVar3->high_low_container != ra_00
  ;
  newelement.bitmap = (roaring_bitmap_t *)ra_00;
LAB_0012267e:
  pq_add(pq,&newelement);
  goto LAB_00122294;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}